

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<long,std::__cxx11::string,std::__cxx11::string,unsigned_long,unsigned_long>
               (ostream *out,char *fmt,long *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
               unsigned_long *args_3,unsigned_long *args_4)

{
  long *in_RCX;
  unsigned_long *in_RSI;
  FormatListRef in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  ostream *out_00;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  out_00 = (ostream *)&stack0xffffffffffffff70;
  makeFormatList<long,std::__cxx11::string,std::__cxx11::string,unsigned_long,unsigned_long>
            (in_RCX,in_R8,in_R9,(unsigned_long *)out_00,in_RSI);
  vformat(out_00,(char *)in_RSI,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}